

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::MergeFrom
          (UniDirectionalLSTMLayerParams *this,UniDirectionalLSTMLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LSTMParams *this_00;
  LSTMWeightParams *this_01;
  LSTMParams *from_00;
  LSTMWeightParams *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb406);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase,
             &(from->activations_).super_RepeatedPtrFieldBase);
  if ((from != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_)
     && (from->params_ != (LSTMParams *)0x0)) {
    this_00 = mutable_params(this);
    from_00 = from->params_;
    if (from_00 == (LSTMParams *)0x0) {
      from_00 = (LSTMParams *)&_LSTMParams_default_instance_;
    }
    LSTMParams::MergeFrom(this_00,from_00);
  }
  if ((from != (UniDirectionalLSTMLayerParams *)&_UniDirectionalLSTMLayerParams_default_instance_)
     && (from->weightparams_ != (LSTMWeightParams *)0x0)) {
    this_01 = mutable_weightparams(this);
    from_01 = from->weightparams_;
    if (from_01 == (LSTMWeightParams *)0x0) {
      from_01 = (LSTMWeightParams *)&_LSTMWeightParams_default_instance_;
    }
    LSTMWeightParams::MergeFrom(this_01,from_01);
  }
  if (from->inputvectorsize_ != 0) {
    this->inputvectorsize_ = from->inputvectorsize_;
  }
  if (from->outputvectorsize_ != 0) {
    this->outputvectorsize_ = from->outputvectorsize_;
  }
  if (from->reverseinput_ == true) {
    this->reverseinput_ = true;
  }
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::MergeFrom(const UniDirectionalLSTMLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  activations_.MergeFrom(from.activations_);
  if (from.has_params()) {
    mutable_params()->::CoreML::Specification::LSTMParams::MergeFrom(from.params());
  }
  if (from.has_weightparams()) {
    mutable_weightparams()->::CoreML::Specification::LSTMWeightParams::MergeFrom(from.weightparams());
  }
  if (from.inputvectorsize() != 0) {
    set_inputvectorsize(from.inputvectorsize());
  }
  if (from.outputvectorsize() != 0) {
    set_outputvectorsize(from.outputvectorsize());
  }
  if (from.reverseinput() != 0) {
    set_reverseinput(from.reverseinput());
  }
}